

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::visitArrayNew<wasm::ArrayNewData>
          (FunctionValidator *this,ArrayNewData *curr)

{
  bool bVar1;
  Module *pMVar2;
  HeapType local_48;
  HeapType heapType;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  ArrayNewData *local_18;
  ArrayNewData *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (ArrayNewData *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  shouldBeTrue<wasm::ArrayNewData*>
            (this,bVar1,local_18,"array.new_{data, elem} requires gc [--enable-gc]");
  local_20.id = (local_18->offset->type).id;
  wasm::Type::Type(&local_28,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewData*,wasm::Type>
            (this,local_20,local_28,local_18,"array.new_{data, elem} offset must be an i32");
  local_30.id = (local_18->size->type).id;
  wasm::Type::Type(&local_38,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewData*,wasm::Type>
            (this,local_30,local_38,local_18,"array.new_{data, elem} size must be an i32");
  heapType.id._4_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)71>).
                      super_Expression.type,(BasicType *)((long)&heapType.id + 4));
  if (!bVar1) {
    bVar1 = wasm::Type::isRef(&(local_18->super_SpecificExpression<(wasm::Expression::Id)71>).
                               super_Expression.type);
    bVar1 = shouldBeTrue<wasm::ArrayNewData*>
                      (this,bVar1,local_18,
                       "array.new_{data, elem} type should be an array reference");
    if (bVar1) {
      local_48 = wasm::Type::getHeapType
                           (&(local_18->super_SpecificExpression<(wasm::Expression::Id)71>).
                             super_Expression.type);
      bVar1 = HeapType::isArray(&local_48);
      shouldBeTrue<wasm::ArrayNewData*>
                (this,bVar1,local_18,"array.new_{data, elem} type should be an array reference");
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNew(ArrayNew* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.new_{data, elem} requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->offset->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} offset must be an i32");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} size must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeTrue(
        curr->type.isRef(),
        curr,
        "array.new_{data, elem} type should be an array reference")) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(),
        curr,
        "array.new_{data, elem} type should be an array reference")) {
    return;
  }
}